

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int wally_tx_get_witness_count(wally_tx *tx,size_t *written)

{
  _Bool _Var1;
  int iVar2;
  wally_tx_witness_stack **ppwVar3;
  size_t *psVar4;
  ulong uVar5;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  _Var1 = is_valid_tx(tx);
  iVar2 = -2;
  if (_Var1 && written != (size_t *)0x0) {
    if (tx->num_inputs != 0) {
      ppwVar3 = &tx->inputs->pegin_witness;
      uVar5 = 0;
      do {
        if (ppwVar3[-0x12] != (wally_tx_witness_stack *)0x0) {
          *written = *written + 1;
        }
        if (ppwVar3[-3] != (wally_tx_witness_stack *)0x0) {
          *written = *written + 1;
        }
        if (ppwVar3[-1] != (wally_tx_witness_stack *)0x0) {
          *written = *written + 1;
        }
        if (*ppwVar3 != (wally_tx_witness_stack *)0x0) {
          *written = *written + 1;
        }
        uVar5 = uVar5 + 1;
        ppwVar3 = ppwVar3 + 0x1a;
      } while (uVar5 < tx->num_inputs);
    }
    if (tx->num_outputs != 0) {
      psVar4 = &tx->outputs->rangeproof_len;
      uVar5 = 0;
      do {
        if (psVar4[-2] != 0) {
          *written = *written + 1;
        }
        if (*psVar4 != 0) {
          *written = *written + 1;
        }
        uVar5 = uVar5 + 1;
        psVar4 = psVar4 + 0xe;
      } while (uVar5 < tx->num_outputs);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int wally_tx_get_witness_count(const struct wally_tx *tx, size_t *written)
{
    size_t i;

    if (written)
        *written = 0;

    if (!is_valid_tx(tx) || !written)
        return WALLY_EINVAL;

    for (i = 0; i < tx->num_inputs; ++i) {
        if (tx->inputs[i].witness)
            *written += 1;
#ifdef BUILD_ELEMENTS
        /* TODO: check the count in the presence of a mix of NULL and non-NULL witnesses */
        if (tx->inputs[i].issuance_amount_rangeproof_len)
            *written += 1;
        if (tx->inputs[i].inflation_keys_rangeproof_len)
            *written += 1;
        if (tx->inputs[i].pegin_witness)
            *written += 1;
#endif
    }

#ifdef BUILD_ELEMENTS
    /* TODO: check the count in the presence of a mix of NULL and non-NULL witnesses */
    for (i = 0; i < tx->num_outputs; ++i) {
        if (tx->outputs[i].surjectionproof_len)
            *written += 1;
        if (tx->outputs[i].rangeproof_len)
            *written += 1;
    }
#endif

    return WALLY_OK;
}